

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

void tinyexr::bitmapFromData
               (unsigned_short *data,int nData,uchar *bitmap,unsigned_short *minNonZero,
               unsigned_short *maxNonZero)

{
  int i;
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  
  bVar3 = 0;
  memset(bitmap,0,0x2000);
  if (0 < nData) {
    uVar2 = 0;
    do {
      bitmap[data[uVar2] >> 3] = bitmap[data[uVar2] >> 3] | (byte)(1 << ((byte)data[uVar2] & 7));
      uVar2 = uVar2 + 1;
    } while ((uint)nData != uVar2);
    bVar3 = *bitmap & 0xfe;
  }
  *bitmap = bVar3;
  *minNonZero = 0x1fff;
  *maxNonZero = 0;
  uVar1 = 0;
  uVar2 = 0;
  do {
    if (bitmap[uVar2] != '\0') {
      if (uVar2 < *minNonZero) {
        *minNonZero = (unsigned_short)uVar2;
        uVar1 = (ulong)*maxNonZero;
      }
      if ((uVar1 & 0xffff) < uVar2) {
        *maxNonZero = (unsigned_short)uVar2;
        uVar1 = uVar2 & 0xffffffff;
      }
    }
    uVar2 = uVar2 + 1;
  } while (uVar2 != 0x2000);
  return;
}

Assistant:

void bitmapFromData(const unsigned short data[/*nData*/], int nData,
                    unsigned char bitmap[BITMAP_SIZE],
                    unsigned short &minNonZero, unsigned short &maxNonZero) {
  for (int i = 0; i < BITMAP_SIZE; ++i) bitmap[i] = 0;

  for (int i = 0; i < nData; ++i) bitmap[data[i] >> 3] |= (1 << (data[i] & 7));

  bitmap[0] &= ~1;  // zero is not explicitly stored in
                    // the bitmap; we assume that the
                    // data always contain zeroes
  minNonZero = BITMAP_SIZE - 1;
  maxNonZero = 0;

  for (int i = 0; i < BITMAP_SIZE; ++i) {
    if (bitmap[i]) {
      if (minNonZero > i) minNonZero = i;
      if (maxNonZero < i) maxNonZero = i;
    }
  }
}